

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfadop.h
# Opt level: O0

value_type __thiscall
TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>::dx
          (TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
           *this,int i)

{
  int in_ESI;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *in_RDI;
  double dVar1;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  dVar1 = TFad<6,_double>::dx((in_RDI->fadexpr_).left_,in_ESI);
  vVar2 = TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::dx
                    (in_RDI,in_stack_ffffffffffffffdc);
  return dVar1 + vVar2;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}